

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O2

bool __thiscall QCommandLinkButton::event(QCommandLinkButton *this,QEvent *e)

{
  long lVar1;
  bool bVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QIcon local_a0;
  QStyleOptionButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(e + 8) == 100) {
    opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionButton::QStyleOptionButton(&opt);
    (**(code **)(*(long *)this + 0x1b8))(this,&opt);
    pQVar3 = QWidget::style((QWidget *)this);
    (**(code **)(*(long *)pQVar3 + 0x100))(&local_a0,pQVar3,0x39,&opt,this);
    QAbstractButton::setIcon((QAbstractButton *)this,&local_a0);
    QIcon::~QIcon(&local_a0);
    QStyleOptionButton::~QStyleOptionButton(&opt);
  }
  bVar2 = QPushButton::event((QPushButton *)this,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLinkButton::event(QEvent *e)
{
    if (e->type() == QEvent::StyleChange) {
        QStyleOptionButton opt;
        initStyleOption(&opt);
        setIcon(style()->standardIcon(QStyle::SP_CommandLink, &opt, this));
    }

    return QPushButton::event(e);
}